

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O0

void __thiscall
ConcurrentStack<int>::ConcurrentStack(ConcurrentStack<int> *this,size_t capacity,milliseconds ms)

{
  size_t capacity_local;
  ConcurrentStack<int> *this_local;
  milliseconds ms_local;
  
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)this);
  this->max_size_ = capacity;
  this->bounded_ = capacity != 0;
  (this->timeout_).__r = ms.__r;
  memset(&this->mutex_,0,0x28);
  std::mutex::mutex(&this->mutex_);
  std::condition_variable::condition_variable(&this->queue_full_);
  std::condition_variable::condition_variable(&this->queue_empty_);
  return;
}

Assistant:

ConcurrentStack(const size_t capacity, const std::chrono::milliseconds ms) :
            max_size_(capacity), bounded_(capacity > 0), timeout_(ms) {}